

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheGL::Initialize
          (ShaderResourceCacheGL *this,TResourceCount *ResCount,IMemoryAllocator *MemAllocator,
          Uint64 DynamicUBOSlotMask,Uint64 DynamicSSBOSlotMask)

{
  Uint16 UVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  CachedUB *pCVar4;
  CachedResourceView *pCVar5;
  CachedSSBO *pCVar6;
  ushort uVar7;
  uint uVar8;
  char (*Args_1_00) [70];
  char (*Args_1_01) [78];
  ulong uVar9;
  short sVar10;
  Uint32 cb;
  ulong uVar11;
  size_t __n;
  Uint32 s;
  string msg;
  char (*Args_1) [76];
  
  this->m_DynamicUBOSlotMask = DynamicUBOSlotMask;
  this->m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;
  if ((this->m_pResourceData)._M_t.
      super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    FormatString<char[35]>(&msg,(char (*) [35])"Cache has already been initialized");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar7 = ResCount->_M_elems[0];
  uVar8 = (uint)uVar7 * 0x18;
  Args_1 = (char (*) [76])(ulong)uVar8;
  this->m_TexturesOffset = (Uint16)uVar8;
  sVar10 = ResCount->_M_elems[1] + uVar7;
  uVar7 = sVar10 * 0x18;
  this->m_ImagesOffset = uVar7;
  UVar1 = (sVar10 + ResCount->_M_elems[2]) * 0x18;
  this->m_SSBOsOffset = UVar1;
  this->m_MemoryEndOffset = ResCount->_M_elems[3] * 0x10 + UVar1;
  if ((unsigned_short)((uVar8 & 0xffff) / 0x18) != ResCount->_M_elems[0]) {
    FormatString<char[26],char[76]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetUBCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER])",Args_1)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x42);
    std::__cxx11::string::~string((string *)&msg);
    Args_1 = (char (*) [76])(ulong)this->m_TexturesOffset;
    uVar7 = this->m_ImagesOffset;
  }
  uVar11 = (ulong)uVar7;
  if ((uint)((uVar11 - ((ulong)Args_1 & 0xffff)) / 0x18) != (uint)ResCount->_M_elems[1]) {
    FormatString<char[26],char[74]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE])",
               (char (*) [74])(ulong)ResCount->_M_elems[1]);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x43);
    std::__cxx11::string::~string((string *)&msg);
    uVar11 = (ulong)this->m_ImagesOffset;
  }
  Args_1_00 = (char (*) [70])(ulong)this->m_SSBOsOffset;
  if ((uint)(((long)Args_1_00 - uVar11) / 0x18) != (uint)ResCount->_M_elems[2]) {
    FormatString<char[26],char[70]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetImageCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE])",Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)&msg);
    Args_1_00 = (char (*) [70])(ulong)this->m_SSBOsOffset;
  }
  uVar7 = this->m_MemoryEndOffset;
  __n = (size_t)uVar7;
  Args_1_01 = (char (*) [78])(ulong)ResCount->_M_elems[3];
  if ((uint)(__n - (long)Args_1_00 >> 4) != (uint)ResCount->_M_elems[3]) {
    FormatString<char[26],char[78]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetSSBOCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER])",
               Args_1_01);
    Args_1_01 = (char (*) [78])0x45;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = this->m_MemoryEndOffset;
    __n = (size_t)uVar7;
  }
  sVar3 = GetRequiredMemorySize(ResCount);
  if ((int)sVar3 != (int)__n) {
    FormatString<char[26],char[46]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BufferSize == GetRequiredMemorySize(ResCount)",
               (char (*) [46])Args_1_01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x4a);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (uVar7 != 0) {
    iVar2 = (**MemAllocator->_vptr_IMemoryAllocator)
                      (MemAllocator,__n,"Shader resource cache data buffer",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                       ,0x4f);
    msg._M_string_length = CONCAT44(extraout_var,iVar2);
    msg._M_dataplus._M_p = (pointer)MemAllocator;
    std::
    __uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    ::operator=((__uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
                 *)&this->m_pResourceData,
                (__uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
                 *)&msg);
    std::unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    ::~unique_ptr((unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
                   *)&msg);
    memset((this->m_pResourceData)._M_t.
           super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  }
  for (uVar8 = 0; uVar7 = this->m_TexturesOffset, uVar8 < uVar7 / 0x18; uVar8 = uVar8 + 1) {
    pCVar4 = GetConstUB(this,uVar8);
    (pCVar4->pBuffer).m_pObject = (BufferGLImpl *)0x0;
    pCVar4->BaseOffset = 0;
    pCVar4->RangeSize = 0;
    pCVar4->DynamicOffset = 0;
  }
  for (uVar8 = 0; uVar11 = (ulong)this->m_ImagesOffset, uVar8 < (uint)((uVar11 - uVar7) / 0x18);
      uVar8 = uVar8 + 1) {
    pCVar5 = GetConstTexture(this,uVar8);
    (pCVar5->field_2).pBuffer = (BufferGLImpl *)0x0;
    (pCVar5->pView).m_pObject = (IDeviceObject *)0x0;
    pCVar5->pTexture = (TextureBaseGL *)0x0;
    uVar7 = this->m_TexturesOffset;
  }
  for (uVar8 = 0; uVar9 = (ulong)this->m_SSBOsOffset, uVar8 < (uint)((uVar9 - uVar11) / 0x18);
      uVar8 = uVar8 + 1) {
    pCVar5 = GetConstImage(this,uVar8);
    (pCVar5->field_2).pBuffer = (BufferGLImpl *)0x0;
    (pCVar5->pView).m_pObject = (IDeviceObject *)0x0;
    pCVar5->pTexture = (TextureBaseGL *)0x0;
    uVar11 = (ulong)this->m_ImagesOffset;
  }
  for (uVar8 = 0; uVar8 < (uint)(this->m_MemoryEndOffset - uVar9 >> 4); uVar8 = uVar8 + 1) {
    pCVar6 = GetConstSSBO(this,uVar8);
    (pCVar6->pBufferView).m_pObject = (BufferViewGLImpl *)0x0;
    pCVar6->DynamicOffset = 0;
    uVar9 = (ulong)this->m_SSBOsOffset;
  }
  return;
}

Assistant:

void ShaderResourceCacheGL::Initialize(const TResourceCount& ResCount, IMemoryAllocator& MemAllocator, Uint64 DynamicUBOSlotMask, Uint64 DynamicSSBOSlotMask)
{
    m_DynamicUBOSlotMask  = DynamicUBOSlotMask;
    m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;

    VERIFY(!m_pResourceData, "Cache has already been initialized");

    // clang-format off
    m_TexturesOffset  = static_cast<Uint16>(m_UBsOffset      + sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER]);
    m_ImagesOffset    = static_cast<Uint16>(m_TexturesOffset + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]);
    m_SSBOsOffset     = static_cast<Uint16>(m_ImagesOffset   + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]);
    m_MemoryEndOffset = static_cast<Uint16>(m_SSBOsOffset    + sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER]);

    VERIFY_EXPR(GetUBCount()      == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER]));
    VERIFY_EXPR(GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE]));
    VERIFY_EXPR(GetImageCount()   == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE]));
    VERIFY_EXPR(GetSSBOCount()    == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER]));
    // clang-format on

    size_t BufferSize = m_MemoryEndOffset;

    VERIFY_EXPR(BufferSize == GetRequiredMemorySize(ResCount));

    if (BufferSize > 0)
    {
        m_pResourceData = decltype(m_pResourceData){
            ALLOCATE(MemAllocator, "Shader resource cache data buffer", Uint8, BufferSize),
            STDDeleter<Uint8, IMemoryAllocator>(MemAllocator) //
        };
        memset(m_pResourceData.get(), 0, BufferSize);
    }

    // Explicitly construct all objects
    for (Uint32 cb = 0; cb < GetUBCount(); ++cb)
        new (&GetUB(cb)) CachedUB;

    for (Uint32 s = 0; s < GetTextureCount(); ++s)
        new (&GetTexture(s)) CachedResourceView;

    for (Uint32 i = 0; i < GetImageCount(); ++i)
        new (&GetImage(i)) CachedResourceView;

    for (Uint32 s = 0; s < GetSSBOCount(); ++s)
        new (&GetSSBO(s)) CachedSSBO;
}